

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_marker(stbi__jpeg *z,int m)

{
  byte bVar1;
  stbi__context *psVar2;
  stbi_uc sVar3;
  sbyte sVar4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  uint uVar9;
  byte *pbVar10;
  stbi_uc *psVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  long lVar16;
  long in_FS_OFFSET;
  bool bVar17;
  int sizes [16];
  uint local_78 [18];
  int iVar8;
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      iVar7 = stbi__get16be(z->s);
      iVar7 = iVar7 + -2;
      do {
        if (iVar7 < 1) goto LAB_00167532;
        psVar2 = z->s;
        pbVar10 = psVar2->img_buffer;
        if (pbVar10 < psVar2->img_buffer_end) {
LAB_001672fa:
          psVar2->img_buffer = pbVar10 + 1;
          bVar5 = *pbVar10;
        }
        else {
          if (psVar2->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar2);
            pbVar10 = psVar2->img_buffer;
            goto LAB_001672fa;
          }
          bVar5 = 0;
        }
        bVar15 = bVar5 & 0xf;
        if (bVar15 < 4 && bVar5 < 0x20) {
          lVar16 = 0;
          uVar9 = 0;
          do {
            psVar2 = z->s;
            pbVar10 = psVar2->img_buffer;
            if (pbVar10 < psVar2->img_buffer_end) {
LAB_00167350:
              psVar2->img_buffer = pbVar10 + 1;
              uVar12 = (uint)*pbVar10;
            }
            else {
              if (psVar2->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar2);
                pbVar10 = psVar2->img_buffer;
                goto LAB_00167350;
              }
              uVar12 = 0;
            }
            local_78[lVar16] = uVar12;
            uVar9 = uVar9 + uVar12;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x10);
          if (0x100 < uVar9) goto LAB_0016737d;
          iVar7 = iVar7 + -0x11;
          if (bVar5 < 0x10) {
            iVar8 = stbi__build_huffman(z->huff_dc + bVar15,(int *)local_78);
            lVar16 = 8;
          }
          else {
            iVar8 = stbi__build_huffman(z->huff_ac + bVar15,(int *)local_78);
            lVar16 = 0x1a48;
          }
          if (iVar8 == 0) goto LAB_0016738d;
          if (uVar9 != 0) {
            uVar14 = 0;
            do {
              psVar2 = z->s;
              psVar11 = psVar2->img_buffer;
              if (psVar11 < psVar2->img_buffer_end) {
LAB_00167442:
                psVar2->img_buffer = psVar11 + 1;
                sVar3 = *psVar11;
              }
              else {
                if (psVar2->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar2);
                  psVar11 = psVar2->img_buffer;
                  goto LAB_00167442;
                }
                sVar3 = '\0';
              }
              z->huff_dc[bVar15].values[uVar14 + lVar16 + -8] = sVar3;
              uVar14 = uVar14 + 1;
            } while (uVar9 != uVar14);
          }
          if (0xf < bVar5) {
            lVar16 = 0;
            do {
              uVar14 = (ulong)z->huff_ac[bVar15].fast[lVar16];
              z->fast_ac[bVar15][lVar16] = 0;
              if (uVar14 != 0xff) {
                bVar5 = z->huff_ac[bVar15].values[uVar14];
                if ((bVar5 & 0xf) != 0) {
                  bVar1 = z->huff_ac[bVar15].size[uVar14];
                  uVar6 = (bVar5 & 0xf) + (ushort)bVar1;
                  if (uVar6 < 10) {
                    uVar13 = (int)lVar16 << (bVar1 & 0x1f) & 0x1ff;
                    sVar4 = (sbyte)(bVar5 & 0xf);
                    uVar12 = -1 << sVar4 | 1;
                    if (0xff < uVar13) {
                      uVar12 = 0;
                    }
                    iVar8 = uVar12 + (uVar13 >> (9U - sVar4 & 0x1f));
                    if ((char)iVar8 == iVar8) {
                      z->fast_ac[bVar15][lVar16] = (short)iVar8 * 0x100 | bVar5 & 0xfff0 | uVar6;
                    }
                  }
                }
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0x200);
          }
          iVar7 = iVar7 - uVar9;
          bVar17 = true;
        }
        else {
LAB_0016737d:
          *(char **)(in_FS_OFFSET + -0x20) = "Corrupt JPEG";
LAB_0016738d:
          bVar17 = false;
        }
      } while (bVar17);
    }
    else {
      if (m != 0xdb) {
LAB_001671e3:
        if ((m == 0xfe || (m & 0xfffffff0U) == 0xe0) && (uVar9 = stbi__get16be(z->s), 1 < uVar9)) {
          if (uVar9 < 7 || m != 0xe0) {
            if (uVar9 < 0xe || m != 0xee) {
              iVar7 = uVar9 - 2;
            }
            else {
              bVar17 = true;
              lVar16 = 0;
              do {
                psVar2 = z->s;
                psVar11 = psVar2->img_buffer;
                if (psVar11 < psVar2->img_buffer_end) {
LAB_001675cd:
                  psVar2->img_buffer = psVar11 + 1;
                  sVar3 = *psVar11;
                }
                else {
                  if (psVar2->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar2);
                    psVar11 = psVar2->img_buffer;
                    goto LAB_001675cd;
                  }
                  sVar3 = '\0';
                }
                if (sVar3 != "Adobe"[lVar16]) {
                  bVar17 = false;
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 != 6);
              if (bVar17) {
                stbi__get8(z->s);
                stbi__get16be(z->s);
                stbi__get16be(z->s);
                bVar5 = stbi__get8(z->s);
                z->app14_color_transform = (uint)bVar5;
                iVar7 = uVar9 - 0xe;
              }
              else {
                iVar7 = uVar9 - 8;
              }
            }
          }
          else {
            bVar17 = true;
            lVar16 = 0;
            do {
              psVar2 = z->s;
              psVar11 = psVar2->img_buffer;
              if (psVar11 < psVar2->img_buffer_end) {
LAB_0016726c:
                psVar2->img_buffer = psVar11 + 1;
                sVar3 = *psVar11;
              }
              else {
                if (psVar2->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar2);
                  psVar11 = psVar2->img_buffer;
                  goto LAB_0016726c;
                }
                sVar3 = '\0';
              }
              if (sVar3 != "JFIF"[lVar16]) {
                bVar17 = false;
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 5);
            iVar7 = uVar9 - 7;
            if (bVar17) {
              z->jfif = 1;
            }
          }
          stbi__skip(z->s,iVar7);
          goto LAB_00167652;
        }
        goto LAB_00167557;
      }
      iVar7 = stbi__get16be(z->s);
      iVar7 = iVar7 + -2;
      do {
        if (iVar7 < 1) goto LAB_00167532;
        psVar2 = z->s;
        pbVar10 = psVar2->img_buffer;
        if (pbVar10 < psVar2->img_buffer_end) {
LAB_001670df:
          psVar2->img_buffer = pbVar10 + 1;
          bVar5 = *pbVar10;
        }
        else {
          if (psVar2->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar2);
            pbVar10 = psVar2->img_buffer;
            goto LAB_001670df;
          }
          bVar5 = 0;
        }
        if (((bVar5 & 0xf0) == 0x10 || bVar5 < 0x10) && ((bVar5 & 0xf) < 4)) {
          lVar16 = 0;
          do {
            psVar2 = z->s;
            if (bVar5 < 0x10) {
              pbVar10 = psVar2->img_buffer;
              if (psVar2->img_buffer_end <= pbVar10) {
                if (psVar2->read_from_callbacks == 0) {
                  uVar6 = 0;
                  goto LAB_00167177;
                }
                stbi__refill_buffer(psVar2);
                pbVar10 = psVar2->img_buffer;
              }
              psVar2->img_buffer = pbVar10 + 1;
              uVar6 = (ushort)*pbVar10;
            }
            else {
              iVar8 = stbi__get16be(psVar2);
              uVar6 = (ushort)iVar8;
            }
LAB_00167177:
            *(ushort *)((long)z->dequant[0] + (ulong)""[lVar16] * 2 + (ulong)((bVar5 & 0xf) << 7)) =
                 uVar6;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x40);
          iVar7 = iVar7 + (uint)(bVar5 < 0x10) * 0x40 + -0x81;
          bVar17 = true;
        }
        else {
          *(char **)(in_FS_OFFSET + -0x20) = "Corrupt JPEG";
          bVar17 = false;
        }
      } while (bVar17);
    }
  }
  else {
    if (m == 0xdd) {
      iVar7 = stbi__get16be(z->s);
      if (iVar7 == 4) {
        iVar7 = stbi__get16be(z->s);
        z->restart_interval = iVar7;
LAB_00167652:
        bVar17 = true;
        goto LAB_00167569;
      }
    }
    else if (m != 0xff) goto LAB_001671e3;
LAB_00167557:
    *(char **)(in_FS_OFFSET + -0x20) = "Corrupt JPEG";
  }
  bVar17 = false;
LAB_00167569:
  return (int)bVar17;
LAB_00167532:
  bVar17 = iVar7 == 0;
  goto LAB_00167569;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            if(n > 256) return stbi__err("bad DHT header","Corrupt JPEG"); // Loop over i < n would write past end of values!
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}